

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeIsAlnum(Unicode61Tokenizer *p,int iCode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = sqlite3Fts5UnicodeCategory(iCode);
  if (p->nException < 1) {
    uVar3 = 0;
  }
  else {
    iVar4 = p->nException + -1;
    uVar3 = 0;
    iVar6 = 0;
    do {
      if (iVar4 < iVar6) goto LAB_001b1122;
      uVar5 = (uint)(iVar4 + iVar6) >> 1;
      iVar1 = p->aiException[uVar5];
      if (iVar1 != iCode) {
        if (iVar1 < iCode) {
          iVar6 = uVar5 + 1;
        }
        else {
          iVar4 = uVar5 - 1;
        }
      }
    } while (iVar1 != iCode);
    uVar3 = 1;
  }
LAB_001b1122:
  return uVar3 ^ p->aCategory[uVar2];
}

Assistant:

static int fts5UnicodeIsAlnum(Unicode61Tokenizer *p, int iCode){
  return (
    p->aCategory[sqlite3Fts5UnicodeCategory((u32)iCode)]
    ^ fts5UnicodeIsException(p, iCode)
  );
}